

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

shared_ptr<Buffer> __thiscall
QPDFObjectHandle::getStreamData(QPDFObjectHandle *this,qpdf_stream_decode_level_e level)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<Buffer> sVar1;
  QPDFObjectHandle local_30;
  undefined8 uStack_18;
  qpdf_stream_decode_level_e level_local;
  QPDFObjectHandle *this_local;
  
  uStack_18 = CONCAT44(in_register_00000034,level);
  this_local = this;
  as_stream(&local_30,(typed)level);
  ::qpdf::Stream::getStreamData((Stream *)this,(qpdf_stream_decode_level_e)&local_30);
  ::qpdf::Stream::~Stream((Stream *)&local_30);
  sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Buffer>)sVar1.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Buffer>
QPDFObjectHandle::getStreamData(qpdf_stream_decode_level_e level)
{
    return as_stream(error).getStreamData(level);
}